

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

uint8_t * __thiscall
aeron::util::MemoryMappedFile::doMapping
          (MemoryMappedFile *this,size_t length,FileHandle fd,size_t offset)

{
  string *function;
  char *pcVar1;
  __off64_t in_RCX;
  int in_EDX;
  size_t in_RSI;
  void *memory;
  string *file;
  string *what;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar2;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [39];
  undefined1 local_81 [56];
  undefined1 local_49 [33];
  uint8_t *local_28;
  
  local_28 = (uint8_t *)mmap64((void *)0x0,in_RSI,3,1,in_EDX,in_RCX);
  if (local_28 == (uint8_t *)0xffffffffffffffff) {
    uVar2 = 1;
    function = (string *)__cxa_allocate_exception(0x48);
    what = (string *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_49 + 1),"failed to Memory Map File",(allocator *)what);
    file = (string *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),
               "uint8_t *aeron::util::MemoryMappedFile::doMapping(size_t, FileHandle, size_t)",
               (allocator *)file);
    pcVar1 = past_prefix((char *)function,(char *)file);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar1,(allocator *)&stack0xffffffffffffff57);
    IOException::IOException
              ((IOException *)
               CONCAT17(in_stack_ffffffffffffff57,CONCAT16(uVar2,in_stack_ffffffffffffff50)),what,
               function,file,(int)((ulong)pcVar1 >> 0x20));
    __cxa_throw(function,&IOException::typeinfo,IOException::~IOException);
  }
  return local_28;
}

Assistant:

uint8_t* MemoryMappedFile::doMapping(size_t length, FileHandle fd, size_t offset)
{
    void* memory = ::mmap(NULL, length, PROT_READ|PROT_WRITE, MAP_SHARED, fd.handle, static_cast<off_t>(offset));

    if (MAP_FAILED == memory)
    {
        throw IOException("failed to Memory Map File", SOURCEINFO);
    }

    return static_cast<uint8_t*>(memory);
}